

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucol_sit.cpp
# Opt level: O0

int32_t ucol_normalizeShortDefinitionString_63
                  (char *definition,char *destination,int32_t capacity,UParseError *parseError,
                  UErrorCode *status)

{
  UBool UVar1;
  undefined1 local_3c8 [8];
  CollatorSpec s;
  UParseError pe;
  UErrorCode *status_local;
  UParseError *parseError_local;
  int32_t capacity_local;
  char *destination_local;
  char *definition_local;
  
  UVar1 = U_FAILURE(*status);
  if (UVar1 == '\0') {
    if (destination != (char *)0x0) {
      memset(destination,0,(long)capacity);
    }
    status_local = &parseError->line;
    if (parseError == (UParseError *)0x0) {
      status_local = &s.entries[0x10].len;
    }
    ucol_sit_initCollatorSpecs((CollatorSpec *)local_3c8);
    ucol_sit_readSpecs((CollatorSpec *)local_3c8,definition,(UParseError *)status_local,status);
    definition_local._4_4_ =
         ucol_sit_dumpSpecs((CollatorSpec *)local_3c8,destination,capacity,status);
  }
  else {
    definition_local._4_4_ = 0;
  }
  return definition_local._4_4_;
}

Assistant:

U_CAPI int32_t U_EXPORT2
ucol_normalizeShortDefinitionString(const char *definition,
                                    char *destination,
                                    int32_t capacity,
                                    UParseError *parseError,
                                    UErrorCode *status)
{

    if(U_FAILURE(*status)) {
        return 0;
    }

    if(destination) {
        uprv_memset(destination, 0, capacity*sizeof(char));
    }

    UParseError pe;
    if(!parseError) {
        parseError = &pe;
    }

    // validate
    CollatorSpec s;
    ucol_sit_initCollatorSpecs(&s);
    ucol_sit_readSpecs(&s, definition, parseError, status);
    return ucol_sit_dumpSpecs(&s, destination, capacity, status);
}